

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool anon_unknown.dwarf_c07b1::AnyTargetCommandOutputMatches
               (string *name,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands_local;
  string *name_local;
  
  __first = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(commands);
  __last = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(commands);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>,(anonymous_namespace)::AnyTargetCommandOutputMatches(std::__cxx11::string_const&,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>const&)::__0>
                    ((__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                      )__last._M_current,(anon_class_8_1_898f2789_for__M_pred)name);
  return bVar1;
}

Assistant:

bool AnyTargetCommandOutputMatches(
  const std::string& name, const std::vector<cmCustomCommand>& commands)
{
  return std::any_of(commands.begin(), commands.end(),
                     [&name](cmCustomCommand const& command) -> bool {
                       return AnyOutputMatches(name, command.GetByproducts());
                     });
}